

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O2

double evaluate2_sweet(Board brd,Block *block,double *inh,bool last_layer)

{
  int *piVar1;
  int iVar2;
  pair<int,_int> pVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int i;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  Board *pBVar11;
  int iVar12;
  Board *pBVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  iVar2 = Board::place(&brd,block);
  pVar3 = Board::eliminate(&brd,block);
  dVar14 = 0.0;
  if (iVar2 == 4) {
    if ((ulong)pVar3 >> 0x20 == 4) {
      dVar14 = 120.0;
    }
    else {
      dVar14 = *(double *)(&DAT_0011f1b0 + (ulong)((ulong)pVar3 >> 0x20 == 3) * 8);
    }
  }
  iVar4 = 0;
  iVar2 = 0;
  pBVar11 = &brd;
  for (lVar8 = 1; lVar8 != 0x15; lVar8 = lVar8 + 1) {
    uVar6 = brd.rows[lVar8];
    pBVar13 = pBVar11;
    for (uVar5 = uVar6 * 2 & ~uVar6 & (int)uVar6 >> 1; uVar5 != 0; uVar5 = uVar5 & ~*piVar1) {
      iVar2 = iVar2 + bitcount[(int)uVar5];
      piVar1 = pBVar13->rows;
      pBVar13 = (Board *)(pBVar13[-1].cols + 0xb);
    }
    iVar4 = iVar4 + -1 + bitcount[(int)((int)uVar6 >> 1 ^ uVar6)];
    pBVar11 = (Board *)(pBVar11->rows + 1);
  }
  iVar7 = 0;
  for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
    uVar6 = brd.cols[lVar8 + 1] >> 1 ^ brd.cols[lVar8 + 1];
    iVar7 = iVar7 + bitcount[uVar6 & 0x7ff] + bitcount[(int)uVar6 >> 0xc];
  }
  iVar10 = 0;
  uVar6 = 0;
  for (lVar8 = 0x14; lVar8 != 1; lVar8 = lVar8 + -1) {
    uVar6 = (uVar6 | brd.rows[lVar8]) & ~brd.rows[lVar8 + -1];
    iVar10 = iVar10 + bitcount[uVar6 & 0x7ff] + bitcount[(int)uVar6 >> 0xc];
  }
  iVar12 = 0;
  iVar9 = 0xe;
  do {
    if (iVar12 == -0x14) {
LAB_0011b257:
      dVar15 = ((double)(block->x - (blockHalfHeight[block->t][block->o] + pVar3.first)) +
                (double)(blockHeight[block->t][block->o] + -1) * 0.5 + -1.0) * -5.00016 +
               (double)pVar3.first * 1.11813;
      *inh = dVar14 + dVar15;
      iVar12 = 0;
      if (0 < iVar9) {
        iVar12 = iVar9;
      }
      if (last_layer) {
        dVar16 = (double)iVar12 * 0.15;
      }
      else {
        dVar16 = 0.0;
      }
      return dVar14 + (double)iVar2 * -8.2856 +
                      ((((double)iVar4 * -6.71788 + dVar15) - (double)iVar7 * (dVar16 + 12.3487)) -
                      (double)iVar10 * (dVar16 + 11.3993));
    }
    if (brd.rows[iVar12 + 0x14] != 0x801) {
      iVar9 = -6 - iVar12;
      goto LAB_0011b257;
    }
    iVar12 = iVar12 + -1;
  } while( true );
}

Assistant:

double evaluate2_sweet(Board brd, const Block &block, double &inh, bool last_layer)
{
    int basenum = brd.place(block);
    pair<int, int> elim = brd.eliminate(&block);
    int *rows = brd.rows;
    int *cols = brd.cols;

    double sweet = 0;
    if (basenum == 4) {
        //sweet += 10;
        sweet += 20;
        if (elim.second == 3)
            sweet += 50;
        if (elim.second == 4)
            sweet += 100;
    }

    double land = block.x - elim.first - blockHalfHeight[block.t][block.o]
                  + (blockHeight[block.t][block.o] - 1) / 2.0 - 1;

    //int cntdown[MAPWIDTH + 2] = {};
    int rowtrans = 0;
    int wellsum = 0;
    for (int i = 1; i <= MAPHEIGHT; ++i) {
        int cur = rows[i];
        rowtrans += bitcount[cur ^ (cur >> 1)] - 1;
        cur = (~cur) & (cur >> 1) & (cur << 1);
        int j = i;
        while (cur) {
            wellsum += bitcount[cur];
            cur &= ~rows[--j];
        }
    }

    int coltrans = 0;
    for (int i = 1; i <= MAPWIDTH; ++i) {
        int cur = cols[i];
        cur ^= cur >> 1;
        coltrans += bitcount[cur & 2047] + bitcount[cur >> 12];
    }

    int holenum = 0;
    int row = 0;
    for (int i = MAPHEIGHT - 1; i > 0; --i) {
        row = (~rows[i]) & (rows[i + 1] | row);
        holenum += bitcount[row & 2047] + bitcount[row >> 12];
    }


    int maxheight = 0;
    for (int i = MAPHEIGHT; i >= 1; --i)
        if (rows[i]^Board::EMPTY_ROW) {
            maxheight = i;
            break;
        }

    const double p[6] = {5.00016, 1.11813, 6.71788, 12.3487, 11.3993, 8.2856};
    inh = - p[0] * land
          + p[1] * elim.first
          + sweet;

    double red_hole = 0;
    if (last_layer == 1)
        red_hole = max(0, RED_HOLE_HEIGHT - maxheight) * RED_HOLE_WEIGHT;
    return  - p[0] * land
            + p[1] * elim.first
            - p[2] * rowtrans
            - (p[3] + red_hole) * coltrans
            - (p[4] + red_hole) * holenum
            - p[5] * wellsum
            + sweet;
    /*inh = - 4.500158825082766 * land
          + 3.4181268101392694 * elim.first
          + sweet;

    return  - 4.500158825082766 * land
            + 3.4181268101392694 * elim.first
            - 3.2178882868487753 * rowtrans
            - 9.348695305445199 * coltrans
            - 7.899265427351652 * holenum
            - 3.3855972247263626 * wellsum
            + sweet;*/
}